

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauEnum.c
# Opt level: O1

void Dau_EnumTestDump(Vec_Ptr_t *vSets,char *pFileName)

{
  void *pvVar1;
  FILE *__stream;
  ulong uVar2;
  long lVar3;
  
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    if (0 < vSets->nSize) {
      uVar2 = 0;
      do {
        pvVar1 = vSets->pArray[uVar2];
        fprintf(__stream,"VARIABLE NUMBER %d:\n",uVar2 & 0xffffffff);
        if (0 < *(int *)((long)pvVar1 + 4)) {
          lVar3 = 0;
          do {
            fprintf(__stream,"%s\n",*(undefined8 *)(*(long *)((long)pvVar1 + 8) + lVar3 * 8));
            lVar3 = lVar3 + 1;
          } while (lVar3 < *(int *)((long)pvVar1 + 4));
        }
        uVar2 = uVar2 + 1;
      } while ((long)uVar2 < (long)vSets->nSize);
    }
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

void Dau_EnumTestDump( Vec_Ptr_t * vSets, char * pFileName )
{ 
    FILE * pFile;
    Vec_Ptr_t * vOne;
    char * pName;
    int v, k;
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        return;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vSets, vOne, v )
    {
        fprintf( pFile, "VARIABLE NUMBER %d:\n", v );
        Vec_PtrForEachEntry( char *, vOne, pName, k )
            fprintf( pFile, "%s\n", pName );
    }
    fclose( pFile );
}